

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O1

int __thiscall OpenMD::StringTokenizer::countTokens(StringTokenizer *this)

{
  long lVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  
  pcVar3 = (this->currentPos_)._M_current;
  cVar2 = (char)this + ' ';
  iVar4 = 0;
LAB_0022c1ee:
  do {
    if (pcVar3 != (this->end_)._M_current) {
      lVar1 = std::__cxx11::string::find(cVar2,(ulong)(uint)(int)*pcVar3);
      if (lVar1 != -1) {
        pcVar3 = pcVar3 + 1;
        iVar4 = iVar4 + (uint)this->returnTokens_;
        goto LAB_0022c1ee;
      }
    }
    if (pcVar3 == (this->end_)._M_current) {
      return iVar4;
    }
    for (; pcVar3 != (this->end_)._M_current; pcVar3 = pcVar3 + 1) {
      lVar1 = std::__cxx11::string::find(cVar2,(ulong)(uint)(int)*pcVar3);
      if (lVar1 != -1) break;
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

int StringTokenizer::countTokens() {
    std::string::const_iterator tmpIter = currentPos_;
    int numToken                        = 0;

    while (true) {
      // skip delimiter first
      while (tmpIter != end_ && isDelimiter(*tmpIter)) {
        ++tmpIter;

        if (returnTokens_) {
          // if delimiter is consider as token
          ++numToken;
        }
      }

      if (tmpIter == end_) { break; }

      // encount a token here
      while (tmpIter != end_ && !isDelimiter(*tmpIter)) {
        ++tmpIter;
      }

      ++numToken;
    }

    return numToken;
  }